

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O3

bool __thiscall Builder::Build(Builder *this,string *err)

{
  BuildConfig *config;
  CommandRunner *pCVar1;
  const_iterator __position;
  bool bVar2;
  byte bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  RealCommandRunner *this_00;
  char *pcVar7;
  int iVar8;
  Edge *this_01;
  Result result;
  int local_74;
  undefined1 local_70 [24];
  size_type local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  Plan *local_40;
  _Rb_tree<Edge*,Edge*,std::_Identity<Edge*>,EdgeCmp,std::allocator<Edge*>> *local_38;
  
  if (((this->plan_).wanted_edges_ < 1) || ((this->plan_).command_edges_ < 1)) {
    __assert_fail("!AlreadyUpToDate()",
                  "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build.cc",
                  0x289,"bool Builder::Build(string *)");
  }
  (**this->status_->_vptr_Status)();
  config = this->config_;
  iVar8 = config->failures_allowed;
  if ((this->command_runner_)._M_t.
      super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
      super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
      super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl == (CommandRunner *)0x0) {
    if (config->dry_run == true) {
      this_00 = (RealCommandRunner *)operator_new(0x58);
      (this_00->super_CommandRunner)._vptr_CommandRunner =
           (_func_int **)&PTR__DryRunCommandRunner_001fd958;
      this_00->config_ = (BuildConfig *)0x0;
      this_00->max_load_average_ = 0.0;
      (this_00->subprocs_).running_.super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (this_00->subprocs_).running_.super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (this_00->subprocs_).running_.super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (this_00->subprocs_).finished_.c.
      super__Deque_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl.super__Deque_impl_data.
      _M_map = (_Map_pointer)0x0;
      (this_00->subprocs_).finished_.c.
      super__Deque_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl.super__Deque_impl_data.
      _M_map_size = 0;
      (this_00->subprocs_).finished_.c.
      super__Deque_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl.super__Deque_impl_data.
      _M_start._M_cur = (_Elt_pointer)0x0;
      (this_00->subprocs_).finished_.c.
      super__Deque_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl.super__Deque_impl_data.
      _M_start._M_first = (_Elt_pointer)0x0;
      (this_00->subprocs_).finished_.c.
      super__Deque_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl.super__Deque_impl_data.
      _M_start._M_last = (_Elt_pointer)0x0;
      std::_Deque_base<Edge_*,_std::allocator<Edge_*>_>::_M_initialize_map
                ((_Deque_base<Edge_*,_std::allocator<Edge_*>_> *)&this_00->config_,0);
    }
    else {
      this_00 = (RealCommandRunner *)operator_new(0x308);
      RealCommandRunner::RealCommandRunner(this_00,config);
    }
    pCVar1 = (this->command_runner_)._M_t.
             super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
             super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
             super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
    (this->command_runner_)._M_t.
    super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
    super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
    super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl = &this_00->super_CommandRunner;
    if (pCVar1 != (CommandRunner *)0x0) {
      (*pCVar1->_vptr_CommandRunner[1])();
    }
  }
  local_40 = &this->plan_;
  (*this->status_->_vptr_Status[4])();
  local_38 = (_Rb_tree<Edge*,Edge*,std::_Identity<Edge*>,EdgeCmp,std::allocator<Edge*>> *)
             &(this->plan_).ready_;
  local_74 = 0;
  do {
    bVar2 = (this->plan_).command_edges_ < 1 || (this->plan_).wanted_edges_ < 1;
    if (bVar2) {
LAB_00192e1e:
      (*this->status_->_vptr_Status[5])();
      return bVar2;
    }
    while( true ) {
      bVar3 = 0;
      if ((iVar8 == 0) ||
         ((this->plan_).ready_._M_t._M_impl.super__Rb_tree_header._M_node_count == 0))
      goto LAB_00192d20;
      iVar6 = (*((this->command_runner_)._M_t.
                 super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
                 super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
                 super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl)->_vptr_CommandRunner[2]
              )();
      if ((char)iVar6 == '\0') break;
      iVar6 = (*((this->command_runner_)._M_t.
                 super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
                 super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
                 super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl)->_vptr_CommandRunner[3]
              )();
      if ((char)iVar6 == '\0') {
        bVar3 = 1;
        goto LAB_00192d20;
      }
      if ((this->plan_).ready_._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
        this_01 = (Edge *)0x0;
      }
      else {
        __position._M_node =
             (this->plan_).ready_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        this_01 = *(Edge **)(__position._M_node + 1);
        std::_Rb_tree<Edge*,Edge*,std::_Identity<Edge*>,EdgeCmp,std::allocator<Edge*>>::
        erase_abi_cxx11_(local_38,__position);
      }
      local_70._0_8_ = local_70 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"generator","");
      bVar4 = Edge::GetBindingBool(this_01,(string *)local_70);
      if ((Edge *)local_70._0_8_ != (Edge *)(local_70 + 0x10)) {
        operator_delete((void *)local_70._0_8_,(ulong)(local_70._16_8_ + 1));
      }
      if (bVar4) {
        BuildLog::Close((this->scan_).build_log_);
      }
      bVar4 = StartEdge(this,this_01,err);
      if (!bVar4) {
LAB_00192e16:
        Cleanup(this);
        goto LAB_00192e1e;
      }
      bVar4 = Edge::is_phony(this_01);
      if (bVar4) {
        bVar4 = Plan::EdgeFinished(local_40,this_01,kEdgeSucceeded,err);
        if (!bVar4) goto LAB_00192e16;
      }
      else {
        local_74 = local_74 + 1;
      }
      bVar4 = (this->plan_).wanted_edges_ < 1;
      bVar5 = (this->plan_).command_edges_ < 1;
      bVar2 = bVar5 || bVar4;
      if (bVar5 || bVar4) goto LAB_00192e1e;
    }
    bVar3 = 0;
LAB_00192d20:
    if (local_74 == 0) {
      (*this->status_->_vptr_Status[5])();
      iVar6 = this->config_->failures_allowed;
      if (iVar8 == 0) {
        if (iVar6 < 2) {
          pcVar7 = "subcommand failed";
        }
        else {
          pcVar7 = "subcommands failed";
        }
      }
      else if (iVar8 < iVar6) {
        pcVar7 = "cannot make progress due to previous errors";
      }
      else {
        pcVar7 = "stuck [this is a bug]";
      }
      std::__cxx11::string::_M_replace((ulong)err,0,(char *)err->_M_string_length,(ulong)pcVar7);
      return bVar2;
    }
    local_70._0_8_ = (Edge *)0x0;
    local_70._16_8_ = &local_50;
    local_58 = 0;
    local_50._M_local_buf[0] = '\0';
    pCVar1 = (this->command_runner_)._M_t.
             super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
             super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
             super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
    iVar6 = (*pCVar1->_vptr_CommandRunner[5])(pCVar1,(Result *)local_70,(ulong)bVar3);
    if (((byte)iVar6 & local_70._8_4_ != ExitInterrupted) == 0) {
      Cleanup(this);
      (*this->status_->_vptr_Status[5])();
      bVar4 = false;
      std::__cxx11::string::_M_replace((ulong)err,0,(char *)err->_M_string_length,0x1b18aa);
    }
    else {
      bVar4 = true;
      if (local_70._8_4_ != ExitTokenAvailable) {
        bVar5 = FinishCommand(this,(Result *)local_70,err);
        local_74 = local_74 + -1;
        if (bVar5) {
          iVar8 = iVar8 - (uint)(local_70._8_4_ != ExitSuccess && iVar8 != 0);
        }
        else {
          Cleanup(this);
          (*this->status_->_vptr_Status[5])();
          bVar4 = false;
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._16_8_ != &local_50) {
      operator_delete((void *)local_70._16_8_,
                      CONCAT71(local_50._M_allocated_capacity._1_7_,local_50._M_local_buf[0]) + 1);
    }
    if (!bVar4) {
      return bVar2;
    }
  } while( true );
}

Assistant:

bool Builder::Build(string* err) {
  assert(!AlreadyUpToDate());

  status_->PlanHasTotalEdges(plan_.command_edge_count());
  int pending_commands = 0;
  int failures_allowed = config_.failures_allowed;

  // Set up the command runner if we haven't done so already.
  if (!command_runner_.get()) {
    if (config_.dry_run)
      command_runner_.reset(new DryRunCommandRunner);
    else
      command_runner_.reset(new RealCommandRunner(config_));
  }

  // We are about to start the build process.
  status_->BuildStarted();

  // This main loop runs the entire build process.
  // It is structured like this:
  // First, we attempt to start as many commands as allowed by the
  // command runner.
  // Second, we attempt to wait for / reap the next finished command.
  while (plan_.more_to_do()) {
    // See if we can start any more commands...
    bool can_run_more =
        failures_allowed   &&
        plan_.more_ready() &&
        command_runner_->CanRunMore();

    // ... but we also need a token to do that.
    if (can_run_more && command_runner_->AcquireToken()) {
      Edge* edge = plan_.FindWork();
      if (edge->GetBindingBool("generator")) {
        scan_.build_log()->Close();
      }
      if (!StartEdge(edge, err)) {
        Cleanup();
        status_->BuildFinished();
        return false;
      }

      if (edge->is_phony()) {
        if (!plan_.EdgeFinished(edge, Plan::kEdgeSucceeded, err)) {
          Cleanup();
          status_->BuildFinished();
          return false;
        }
      } else {
        ++pending_commands;
      }

      // We made some progress; go back to the main loop.
      continue;
    }

    // See if we can reap any finished commands.
    if (pending_commands) {
      CommandRunner::Result result;
      if (!command_runner_->WaitForCommand(&result, can_run_more) ||
          result.status == ExitInterrupted) {
        Cleanup();
        status_->BuildFinished();
        *err = "interrupted by user";
        return false;
      }

      // We might be able to start another command; start the main loop over.
      if (result.status == ExitTokenAvailable)
        continue;

      --pending_commands;
      if (!FinishCommand(&result, err)) {
        Cleanup();
        status_->BuildFinished();
        return false;
      }

      if (!result.success()) {
        if (failures_allowed)
          failures_allowed--;
      }

      // We made some progress; start the main loop over.
      continue;
    }

    // If we get here, we cannot make any more progress.
    status_->BuildFinished();
    if (failures_allowed == 0) {
      if (config_.failures_allowed > 1)
        *err = "subcommands failed";
      else
        *err = "subcommand failed";
    } else if (failures_allowed < config_.failures_allowed)
      *err = "cannot make progress due to previous errors";
    else
      *err = "stuck [this is a bug]";

    return false;
  }

  status_->BuildFinished();
  return true;
}